

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

void predict_or_learn_multi<true,true>(nn *n,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  uchar **ppuVar3;
  polylabel *ppVar4;
  features *pfVar5;
  float fVar6;
  int iVar7;
  uint32_t uVar8;
  vw *pvVar9;
  shared_data *psVar10;
  _func_void_shared_data_ptr_float *p_Var11;
  loss_function *plVar12;
  bool *pbVar13;
  polyprediction *ppVar14;
  shared_data *psVar15;
  uint64_t uVar16;
  _func_void_int_string_v_array<char> *p_Var17;
  float fVar18;
  label_t lVar19;
  wclass *pwVar20;
  size_t sVar21;
  v_array<char> vVar22;
  byte bVar23;
  bool bVar24;
  ostream *poVar25;
  long lVar26;
  uint i;
  ulong uVar27;
  polyprediction *ppVar28;
  features *pfVar29;
  char *pcVar30;
  features *pfVar31;
  uint i_1;
  float *pfVar32;
  ulong uVar33;
  long lVar34;
  example *peVar35;
  uint uVar36;
  example *peVar37;
  byte bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float extraout_XMM0_Da;
  float fVar42;
  features save_nn_output_namespace;
  ostringstream outputStringStream;
  shared_data sd;
  example *peVar43;
  example *peVar44;
  undefined4 in_stack_fffffffffffffc50;
  float fVar45;
  float fVar46;
  undefined4 in_stack_fffffffffffffc58;
  int iVar47;
  undefined4 in_stack_fffffffffffffc5c;
  example *peVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  float local_378;
  float local_374;
  float local_370;
  undefined1 *local_310;
  undefined1 local_300 [16];
  char local_2f0 [96];
  float local_290;
  undefined1 local_288 [376];
  shared_data local_110;
  
  bVar38 = 0;
  iVar7 = n->all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,n->all);
  }
  pvVar9 = n->all;
  memcpy(&local_110,pvVar9->sd,0xe0);
  psVar10 = pvVar9->sd;
  pvVar9->sd = &local_110;
  if (n->dropout == false) {
    fVar39 = 1.0;
  }
  else {
    fVar39 = 2.0;
  }
  fVar6 = (ec->l).simple.label;
  p_Var11 = n->all->set_minmax;
  plVar12 = n->all->loss;
  pbVar13 = n->dropped_out;
  ppVar14 = n->hidden_units_pred;
  uVar50 = SUB84(n->hiddenbias_pred,0);
  uVar51 = (undefined4)((ulong)n->hiddenbias_pred >> 0x20);
  peVar43 = ec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar15 = n->all->sd;
  fVar45 = psVar15->min_label;
  psVar15->min_label = -3.0;
  psVar15 = n->all->sd;
  fVar46 = psVar15->max_label;
  psVar15->max_label = 3.0;
  uVar16 = (ec->super_example_predict).ft_offset;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
  }
  peVar37 = &n->hiddenbias;
  (n->hiddenbias).super_example_predict.ft_offset = (ec->super_example_predict).ft_offset;
  uVar36 = n->k;
  uVar33 = (ulong)uVar36;
  if (*(code **)(base + 0x40) == (code *)0x0) {
    lVar26 = CONCAT44(uVar51,uVar50);
    ec = peVar43;
    if (uVar33 != 0) {
      lVar34 = 0;
      do {
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37);
        fVar40 = (n->hiddenbias).pred.scalar;
        fVar41 = *(float *)((long)&(n->hiddenbias).pred + 4);
        fVar42 = *(float *)((long)&(n->hiddenbias).pred + 8);
        fVar18 = *(float *)((long)&(n->hiddenbias).pred + 0xc);
        *(undefined1 (*) [16])(lVar26 + 0x10 + lVar34) =
             *(undefined1 (*) [16])((long)&(n->hiddenbias).pred + 0x10);
        pfVar32 = (float *)(lVar26 + lVar34);
        *pfVar32 = fVar40;
        pfVar32[1] = fVar41;
        pfVar32[2] = fVar42;
        pfVar32[3] = fVar18;
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        lVar34 = lVar34 + 0x20;
      } while (uVar33 << 5 != lVar34);
    }
    puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
    *puVar1 = *puVar1 - (ulong)(uVar36 * *(int *)(base + 0xe0));
    peVar43 = ec;
    peVar48 = peVar37;
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37,uVar33,
               *(undefined8 *)(base + 0xe0),CONCAT44(uVar51,uVar50),1);
    peVar48 = (example *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
  }
  uVar33 = (ulong)n->k;
  if (n->k != 0) {
    uVar27 = 0;
    pfVar32 = (float *)CONCAT44(uVar51,uVar50);
    ec = peVar43;
    do {
      if ((*pfVar32 == 0.0) && (!NAN(*pfVar32))) {
        fVar40 = merand48(&n->all->random_state);
        (n->hiddenbias).l.simple.label = fVar40 + -0.5;
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar27);
        (**(code **)(base + 0x28))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37);
        puVar1 = &(n->hiddenbias).super_example_predict.ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar27);
        (n->hiddenbias).l.multi.label = 0x7f7fffff;
      }
      uVar27 = uVar27 + 1;
      uVar33 = (ulong)n->k;
      pfVar32 = pfVar32 + 8;
      peVar43 = ec;
    } while (uVar27 < uVar33);
  }
  if (*(code **)(base + 0x40) == (code *)0x0) {
    iVar47 = (int)uVar33;
    uVar49 = 0;
    if (uVar33 != 0) {
      lVar26 = 0;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        fVar40 = (ec->pred).scalar;
        fVar41 = *(float *)((long)&ec->pred + 4);
        fVar42 = *(float *)((long)&ec->pred + 8);
        fVar18 = *(float *)((long)&ec->pred + 0xc);
        *(undefined1 (*) [16])((long)ppVar14 + lVar26 + 0x10) =
             *(undefined1 (*) [16])((long)&ec->pred + 0x10);
        pfVar32 = (float *)((long)ppVar14 + lVar26);
        *pfVar32 = fVar40;
        pfVar32[1] = fVar41;
        pfVar32[2] = fVar42;
        pfVar32[3] = fVar18;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        lVar26 = lVar26 + 0x20;
      } while (uVar33 << 5 != lVar26);
    }
    peVar48 = (example *)CONCAT44(uVar49,iVar47);
    puVar1 = &(ec->super_example_predict).ft_offset;
    *puVar1 = *puVar1 - (ulong)(uint)(iVar47 * *(int *)(base + 0xe0));
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,uVar33,
               *(undefined8 *)(base + 0xe0),ppVar14,1);
  }
  lVar26 = CONCAT44(uVar51,uVar50);
  if (n->k != 0) {
    uVar33 = 0;
    do {
      if (n->dropout == true) {
        fVar40 = merand48(&n->xsubi);
        bVar24 = fVar40 < 0.5;
      }
      else {
        bVar24 = false;
      }
      pbVar13[uVar33] = bVar24;
      uVar33 = uVar33 + 1;
    } while (uVar33 < n->k);
  }
  if ((peVar43->passthrough != (features *)0x0) && (n->k != 0)) {
    uVar36 = 1;
    lVar34 = 0;
    uVar33 = 0;
    do {
      if (peVar43->passthrough != (features *)0x0) {
        features::push_back(peVar43->passthrough,*(feature_value *)(lVar26 + lVar34),
                            (ulong)(uVar36 - 1) ^ 0x398d9fda640553);
      }
      if (peVar43->passthrough != (features *)0x0) {
        features::push_back(peVar43->passthrough,*(feature_value *)((long)ppVar14 + lVar34),
                            (ulong)uVar36 ^ 0x398d9fda640553);
      }
      uVar33 = uVar33 + 1;
      lVar34 = lVar34 + 0x20;
      uVar36 = uVar36 + 2;
    } while (uVar33 < n->k);
  }
  if ((0 < iVar7) && (n->k != 0)) {
    uVar33 = 0;
    ppVar28 = ppVar14;
    do {
      if (uVar33 != 0) {
        local_2f0[0] = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      }
      poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
      local_2f0[0] = ':';
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,local_2f0,1);
      poVar25 = std::ostream::_M_insert<double>((double)ppVar28->scalar);
      local_2f0[0] = ',';
      std::__ostream_insert<char,std::char_traits<char>>(poVar25,local_2f0,1);
      fVar41 = ppVar28->scalar * -2.0 * 1.442695;
      fVar40 = -126.0;
      if (-126.0 <= fVar41) {
        fVar40 = fVar41;
      }
      fVar41 = (fVar40 - (float)(int)fVar40) + (float)(-(uint)(fVar41 < 0.0) & 0x3f800000);
      std::ostream::_M_insert<double>
                ((double)(2.0 / ((float)(long)((fVar41 * -1.4901291 +
                                               27.728024 / (4.8425255 - fVar41) +
                                               fVar40 + 121.274055) * 8388608.0) + 1.0) + -1.0));
      uVar33 = uVar33 + 1;
      ppVar28 = ppVar28 + 1;
    } while (uVar33 < n->k);
  }
  ppVar4 = &peVar43->l;
  n->all->loss = plVar12;
  n->all->set_minmax = p_Var11;
  n->all->sd->min_label = fVar45;
  n->all->sd->max_label = fVar46;
  (peVar43->super_example_predict).ft_offset = uVar16;
  peVar37 = &n->outputweight;
  ppVar2 = &(n->output_layer).l;
  pfVar5 = (peVar43->super_example_predict).feature_space + 0x81;
  bVar23 = 1;
  local_374 = 0.0;
  local_370 = 0.0;
  local_378 = 0.0;
  peVar35 = peVar43;
  peVar44 = peVar43;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (peVar35->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar15 = n->all->sd;
    fVar45 = psVar15->min_label;
    psVar15->min_label = -1.0;
    psVar15 = n->all->sd;
    fVar46 = psVar15->max_label;
    psVar15->max_label = 1.0;
    peVar35 = peVar44;
    if (n->k != 0) {
      uVar33 = 0;
      ppVar28 = ppVar14;
      do {
        fVar40 = 0.0;
        if (pbVar13[uVar33] == false) {
          fVar41 = ppVar28->scalar * -2.0 * 1.442695;
          fVar40 = -126.0;
          if (-126.0 <= fVar41) {
            fVar40 = fVar41;
          }
          fVar41 = (fVar40 - (float)(int)fVar40) + (float)(-(uint)(fVar41 < 0.0) & 0x3f800000);
          fVar40 = (2.0 / ((float)(long)((fVar41 * -1.4901291 +
                                         27.728024 / (4.8425255 - fVar41) + fVar40 + 121.274055) *
                                        8388608.0) + 1.0) + -1.0) * fVar39;
        }
        (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar33] = fVar40;
        (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar40 * fVar40;
        (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
             fVar40 * fVar40 +
             (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
        *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
             (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar33];
        uVar8 = n->k;
        puVar1 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
        (**(code **)(base + 0x30))
                  (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37);
        uVar50 = (undefined4)((ulong)peVar48 >> 0x20);
        puVar1 = &(n->outputweight).super_example_predict.ft_offset;
        *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
        fVar40 = (n->outputweight).pred.scalar;
        if ((fVar40 == 0.0) && (!NAN(fVar40))) {
          fVar40 = (float)n->k;
          if (fVar40 < 0.0) {
            fVar40 = sqrtf(fVar40);
          }
          else {
            fVar40 = SQRT(fVar40);
          }
          fVar41 = merand48(&n->all->random_state);
          (n->outputweight).l.simple.label = (fVar41 + -0.5) / fVar40;
          uVar8 = n->k;
          puVar1 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
          (**(code **)(base + 0x38))
                    (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37);
          peVar48 = (example *)CONCAT44(uVar50,fVar40);
          puVar1 = &(n->outputweight).super_example_predict.ft_offset;
          *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
          (n->outputweight).l.multi.label = 0x7f7fffff;
        }
        uVar33 = uVar33 + 1;
        ppVar28 = ppVar28 + 1;
      } while (uVar33 < n->k);
    }
    n->all->loss = plVar12;
    n->all->set_minmax = p_Var11;
    n->all->sd->min_label = fVar45;
    n->all->sd->max_label = fVar46;
    peVar44 = peVar35;
    if (n->inpass == false) {
      (n->output_layer).super_example_predict.ft_offset = (peVar35->super_example_predict).ft_offset
      ;
      (n->output_layer).l.cb_eval.event.costs.erase_count =
           (peVar43->l).cb_eval.event.costs.erase_count;
      lVar19 = ppVar4->multi;
      pwVar20 = (peVar43->l).cs.costs._end;
      sVar21 = (peVar43->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (peVar43->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar21;
      ppVar2->multi = lVar19;
      (n->output_layer).l.cs.costs._end = pwVar20;
      (n->output_layer).weight = peVar35->weight;
      (n->output_layer).partial_prediction = 0.0;
      uVar8 = n->k;
      puVar1 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
      (**(code **)(base + 0x28))
                (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&n->output_layer);
      puVar1 = &(n->output_layer).super_example_predict.ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
      (peVar43->l).cb_eval.event.costs.erase_count =
           (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar19 = ppVar2->multi;
      pwVar20 = (n->output_layer).l.cs.costs._end;
      sVar21 = (n->output_layer).l.cs.costs.erase_count;
      (peVar43->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (peVar43->l).cs.costs.erase_count = sVar21;
      ppVar4->multi = lVar19;
      (peVar43->l).cs.costs._end = pwVar20;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar35,&nn_output_namespace);
      pfVar29 = pfVar5;
      pcVar30 = local_2f0;
      for (lVar26 = 0xd; lVar26 != 0; lVar26 = lVar26 + -1) {
        *(float **)pcVar30 = (pfVar29->values)._begin;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar38 * -0x10 + 8);
        pcVar30 = pcVar30 + ((ulong)bVar38 * -2 + 1) * 8;
      }
      pfVar29 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar31 = pfVar5;
      for (lVar26 = 0xc; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pfVar31->values)._begin = (pfVar29->values)._begin;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar38 * -0x10 + 8);
        pfVar31 = (features *)((long)pfVar31 + (ulong)bVar38 * -0x10 + 8);
      }
      (peVar43->super_example_predict).feature_space[0x81].sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      peVar35->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           peVar35->total_sum_feat_sq;
      uVar8 = n->k;
      puVar1 = &(peVar35->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar35);
      puVar1 = &(peVar35->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
      (n->output_layer).partial_prediction = peVar35->partial_prediction;
      (n->output_layer).loss = peVar35->loss;
      peVar35->total_sum_feat_sq =
           peVar35->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      (peVar35->super_example_predict).feature_space[0x81].sum_feat_sq = 0.0;
      pcVar30 = local_2f0;
      pfVar29 = pfVar5;
      for (lVar26 = 0xc; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pfVar29->values)._begin = *(float **)pcVar30;
        pcVar30 = pcVar30 + ((ulong)bVar38 * -2 + 1) * 8;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar38 * -0x10 + 8);
      }
      (peVar43->super_example_predict).feature_space[0x81].sum_feat_sq = local_290;
      ppuVar3 = &(peVar35->super_example_predict).indices._end;
      *ppuVar3 = *ppuVar3 + -1;
    }
    fVar40 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar40;
    if (0 < iVar7) {
      local_2f0[0] = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_288,local_2f0,1);
      std::ostream::_M_insert<double>((double)(n->output_layer).partial_prediction);
      p_Var17 = n->all->print_text;
      iVar47 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar22._end._0_4_ = in_stack_fffffffffffffc50;
      vVar22._begin = (char *)peVar44;
      vVar22._end._4_4_ = fVar46;
      vVar22.end_array._0_4_ = (int)peVar48;
      vVar22.end_array._4_4_ = (int)((ulong)peVar48 >> 0x20);
      vVar22.erase_count._0_4_ = fVar45;
      vVar22.erase_count._4_4_ = uVar51;
      (*p_Var17)(iVar47,(string)peVar43->tag,vVar22);
      if (local_310 != local_300) {
        operator_delete(local_310);
      }
    }
    pvVar9 = n->all;
    if ((pvVar9->training == true) &&
       (((fVar6 != 3.4028235e+38 || (NAN(fVar6))) &&
        ((*pvVar9->loss->_vptr_loss_function[6])(pvVar9->loss,pvVar9->sd), extraout_XMM0_Da != 0.0))
       )) {
      n->all->loss = n->squared_loss;
      n->all->set_minmax = noop_mm;
      psVar15 = n->all->sd;
      fVar45 = psVar15->min_label;
      psVar15->min_label = -3.0;
      psVar15 = n->all->sd;
      fVar46 = psVar15->max_label;
      psVar15->max_label = 3.0;
      uVar16 = (peVar35->super_example_predict).ft_offset;
      if (n->multitask == true) {
        (peVar35->super_example_predict).ft_offset = 0;
      }
      peVar35 = peVar44;
      if (n->k != 0) {
        uVar33 = 0;
        ppVar28 = ppVar14;
        fVar40 = extraout_XMM0_Da;
        do {
          uVar50 = (undefined4)((ulong)peVar48 >> 0x20);
          peVar35 = peVar44;
          if (pbVar13[uVar33] == false) {
            fVar41 = (n->output_layer).super_example_predict.feature_space[0x81].values._begin
                     [uVar33];
            *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
                 (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar33]
            ;
            uVar8 = n->k;
            puVar1 = &(n->outputweight).super_example_predict.ft_offset;
            *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar8);
            (**(code **)(base + 0x30))
                      (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar37);
            puVar1 = &(n->outputweight).super_example_predict.ft_offset;
            *puVar1 = *puVar1 - (ulong)(uVar8 * *(int *)(base + 0xe0));
            fVar42 = GD::finalize_prediction
                               (n->all->sd,
                                (n->outputweight).pred.scalar * -0.5 * fVar40 *
                                (1.0 - (fVar41 / fVar39) * (fVar41 / fVar39)) * fVar39 +
                                ppVar28->scalar);
            peVar48 = (example *)CONCAT44(uVar50,fVar41);
            (peVar44->l).simple.label = fVar42;
            (peVar44->pred).scalar = ppVar28->scalar;
            peVar35 = peVar44;
            if ((fVar42 != ppVar28->scalar) || (NAN(fVar42) || NAN(ppVar28->scalar))) {
              puVar1 = &(peVar44->super_example_predict).ft_offset;
              *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar33);
              (**(code **)(base + 0x38))
                        (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),peVar44);
              peVar48 = (example *)CONCAT44(uVar50,fVar41);
              puVar1 = &(peVar44->super_example_predict).ft_offset;
              *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)uVar33);
            }
          }
          uVar33 = uVar33 + 1;
          ppVar28 = ppVar28 + 1;
          peVar44 = peVar35;
        } while (uVar33 < n->k);
      }
      n->all->loss = plVar12;
      n->all->set_minmax = p_Var11;
      n->all->sd->min_label = fVar45;
      n->all->sd->max_label = fVar46;
      (peVar35->super_example_predict).ft_offset = uVar16;
      peVar44 = peVar35;
    }
    (ppVar4->simple).label = fVar6;
    if (bVar23 != 0) {
      local_370 = n->prediction;
      local_374 = (n->output_layer).partial_prediction;
      local_378 = (n->output_layer).loss;
    }
    if ((bVar23 & n->dropout) != 1) break;
    bVar23 = 0;
    if (n->k != 0) {
      uVar33 = 0;
      do {
        pbVar13[uVar33] = (bool)(pbVar13[uVar33] ^ 1);
        uVar33 = uVar33 + 1;
      } while (uVar33 < n->k);
      bVar23 = 0;
    }
  }
  peVar35->partial_prediction = local_374;
  (peVar35->pred).scalar = local_370;
  peVar35->loss = local_378;
  n->all->sd = psVar10;
  (*n->all->set_minmax)(n->all->sd,local_110.min_label);
  (*n->all->set_minmax)(n->all->sd,local_110.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
  std::ios_base::~ios_base((ios_base *)(local_288 + 0x70));
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}